

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

Type Internal_FigureTypeFromHashedFontName(InternalHashToName *key)

{
  Type TVar1;
  int iVar2;
  void *pvVar3;
  
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::single_stroke_name_map ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 single_stroke_name_map);
    if (iVar2 != 0) {
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0].m_dirty_name_hash
                 ,L"Machine Tool Gothic",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0].m_family_name =
           L"Machine Tool Gothic";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[1].m_dirty_name_hash
                 ,L"MachineToolGothic",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[1].m_family_name =
           L"MachineToolGothic";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[2].m_dirty_name_hash
                 ,L"Machine Tool Grenadier",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[2].m_family_name =
           L"Machine Tool Grenadier";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[3].m_dirty_name_hash
                 ,L"MachineToolGrenadier",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[3].m_family_name =
           L"MachineToolGrenadier";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[4].m_dirty_name_hash
                 ,L"Machine Tool Handscript",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[4].m_family_name =
           L"Machine Tool Handscript";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[5].m_dirty_name_hash
                 ,L"MachineToolHandscript",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[5].m_family_name =
           L"MachineToolHandscript";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[6].m_dirty_name_hash
                 ,L"Machine Tool SanSerif",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[6].m_family_name =
           L"Machine Tool SanSerif";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[7].m_dirty_name_hash
                 ,L"MachineToolSanSerif",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[7].m_family_name =
           L"MachineToolSanSerif";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[8].m_dirty_name_hash
                 ,L"Machine Tool Script",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[8].m_family_name =
           L"Machine Tool Script";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[9].m_dirty_name_hash
                 ,L"MachineToolScript",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[9].m_family_name =
           L"MachineToolScript";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[10].
                  m_dirty_name_hash,L"MecSoft_Font-1",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[10].m_family_name =
           L"MecSoft_Font-1";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xb].
                  m_dirty_name_hash,L"MecSoft_Font-1",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xb].m_family_name =
           L"MecSoft_Font-1";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xc].
                  m_dirty_name_hash,L"OrachTech1Lotf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xc].m_family_name =
           L"OrachTech1Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xd].
                  m_dirty_name_hash,L"OrachTech1Lotf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xd].m_family_name =
           L"OrachTech1Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xe].
                  m_dirty_name_hash,L"OrachTechDemo1Lotf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xe].m_family_name =
           L"OrachTechDemo1Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xf].
                  m_dirty_name_hash,L"OrachTechDemo1Lotf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0xf].m_family_name =
           L"OrachTechDemo1Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x10].
                  m_dirty_name_hash,L"OrachTech1Lttf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x10].m_family_name =
           L"OrachTech1Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x11].
                  m_dirty_name_hash,L"OrachTech1Lttf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x11].m_family_name =
           L"OrachTech1Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x12].
                  m_dirty_name_hash,L"OrachTechDemo1Lttf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x12].m_family_name =
           L"OrachTechDemo1Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x13].
                  m_dirty_name_hash,L"OrachTechDemo1Lttf",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x13].m_family_name =
           L"OrachTechDemo1Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x14].
                  m_dirty_name_hash,L"RHSS",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x14].m_family_name = L"RHSS";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x15].
                  m_dirty_name_hash,L"RhSS-Normal",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x15].m_family_name =
           L"RhSS-Normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x16].
                  m_dirty_name_hash,L"SDstroke",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x16].m_family_name =
           L"SDstroke";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x17].
                  m_dirty_name_hash,L"SDstroke-latin",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x17].m_family_name =
           L"SDstroke-latin";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x18].
                  m_dirty_name_hash,L"SLF-RHN Architect",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x18].m_family_name =
           L"SLF-RHN Architect";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x19].
                  m_dirty_name_hash,L"SLF-RHN-Architect",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x19].m_family_name =
           L"SLF-RHN-Architect";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1a].
                  m_dirty_name_hash,L"SLF-RHN Industrial",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1a].m_family_name =
           L"SLF-RHN Industrial";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1b].
                  m_dirty_name_hash,L"SLF-RHN-Industrial",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1b].m_family_name =
           L"SLF-RHN-Industrial";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1c].
                  m_dirty_name_hash,L"SLF-RHN White Linen",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1c].m_family_name =
           L"SLF-RHN White Linen";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1d].
                  m_dirty_name_hash,L"SLF-RHN-WhiteLiinen",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1d].m_family_name =
           L"SLF-RHN-WhiteLiinen";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1e].
                  m_dirty_name_hash,L"AVGauge Engraving",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1e].m_family_name =
           L"AVGauge Engraving";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1f].
                  m_dirty_name_hash,L"AVGauge_Engraving",false);
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map[0x1f].m_family_name =
           L"AVGauge_Engraving";
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           single_stroke_name_map);
    }
  }
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::double_stroke_name_map ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 double_stroke_name_map);
    if (iVar2 != 0) {
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0].m_dirty_name_hash
                 ,L"1CamBam_Stick_1",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0].m_family_name =
           L"1CamBam_Stick_1";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[1].m_dirty_name_hash
                 ,L"1CamBamStick1-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[1].m_family_name =
           L"1CamBamStick1-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[2].m_dirty_name_hash
                 ,L"1CamBam_Stick_2",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[2].m_family_name =
           L"1CamBam_Stick_2";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[3].m_dirty_name_hash
                 ,L"1CamBamStick2-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[3].m_family_name =
           L"1CamBamStick2-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[4].m_dirty_name_hash
                 ,L"1CamBam_Stick_3",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[4].m_family_name =
           L"1CamBam_Stick_3";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[5].m_dirty_name_hash
                 ,L"1CamBamStick3-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[5].m_family_name =
           L"1CamBamStick3-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[6].m_dirty_name_hash
                 ,L"1CamBam_Stick_4",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[6].m_family_name =
           L"1CamBam_Stick_4";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[7].m_dirty_name_hash
                 ,L"1CamBamStick4-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[7].m_family_name =
           L"1CamBamStick4-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[8].m_dirty_name_hash
                 ,L"1CamBam_Stick_5",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[8].m_family_name =
           L"1CamBam_Stick_5";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[9].m_dirty_name_hash
                 ,L"1CamBamStick5-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[9].m_family_name =
           L"1CamBamStick5-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[10].
                  m_dirty_name_hash,L"1CamBam_Stick_6",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[10].m_family_name =
           L"1CamBam_Stick_6";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xb].
                  m_dirty_name_hash,L"1CamBamStick6-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xb].m_family_name =
           L"1CamBamStick6-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xc].
                  m_dirty_name_hash,L"1CamBam_Stick_7",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xc].m_family_name =
           L"1CamBam_Stick_7";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xd].
                  m_dirty_name_hash,L"1CamBamStick7-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xd].m_family_name =
           L"1CamBamStick7-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xe].
                  m_dirty_name_hash,L"1CamBam_Stick_8",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xe].m_family_name =
           L"1CamBam_Stick_8";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xf].
                  m_dirty_name_hash,L"1CamBamStick8-normal",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0xf].m_family_name =
           L"1CamBamStick8-normal";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x10].
                  m_dirty_name_hash,L"1CamBam_Stick_9",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x10].m_family_name =
           L"1CamBam_Stick_9";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x11].
                  m_dirty_name_hash,L"1CamBamStick9",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x11].m_family_name =
           L"1CamBamStick9";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x12].
                  m_dirty_name_hash,L"CNC Vector",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x12].m_family_name =
           L"CNC Vector";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x13].
                  m_dirty_name_hash,L"CNCVector",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x13].m_family_name =
           L"CNCVector";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x14].
                  m_dirty_name_hash,L"CNC Vector Mirror",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x14].m_family_name =
           L"CNC Vector Mirror";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x15].
                  m_dirty_name_hash,L"CNCVectorMirror",false);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map[0x15].m_family_name =
           L"CNCVectorMirror";
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           double_stroke_name_map);
    }
  }
  if (Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::perimeter_name_map == '\0')
  {
    iVar2 = __cxa_guard_acquire(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                                 perimeter_name_map);
    if (iVar2 != 0) {
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0].m_dirty_name_hash,
                 L"Arial",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0].m_family_name = L"Arial";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[1].m_dirty_name_hash,
                 L"Bahnschrift",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[1].m_family_name = L"Bahnschrift";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[2].m_dirty_name_hash,
                 L"CityBlueprint",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[2].m_family_name = L"CityBlueprint";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[3].m_dirty_name_hash,
                 L"CountryBlueprint",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[3].m_family_name =
           L"CountryBlueprint";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[4].m_dirty_name_hash,
                 L"Courier",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[4].m_family_name = L"Courier";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[5].m_dirty_name_hash,
                 L"Courier New",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[5].m_family_name = L"Courier New";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[6].m_dirty_name_hash,
                 L"Franklin Gothic",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[6].m_family_name =
           L"Franklin Gothic";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[7].m_dirty_name_hash,
                 L"Helvetica",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[7].m_family_name = L"Helvetica";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[8].m_dirty_name_hash,
                 L"Helvetica Neue",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[8].m_family_name = L"Helvetica Neue"
      ;
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[9].m_dirty_name_hash,
                 L"Segoe UI",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[9].m_family_name = L"Segoe UI";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[10].m_dirty_name_hash,
                 L"Times New Roman",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[10].m_family_name =
           L"Times New Roman";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xb].m_dirty_name_hash,
                 L"Tecnnic",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xb].m_family_name = L"Tecnnic";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xc].m_dirty_name_hash,
                 L"ArialMT",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xc].m_family_name = L"ArialMT";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xd].m_dirty_name_hash,
                 L"CourierNewPS",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xd].m_family_name = L"CourierNewPS"
      ;
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xe].m_dirty_name_hash,
                 L"CourierNewPSMT",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xe].m_family_name =
           L"CourierNewPSMT";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xf].m_dirty_name_hash,
                 L"FranklinGothic",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0xf].m_family_name =
           L"FranklinGothic";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x10].m_dirty_name_hash,
                 L"HelveticaNeue",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x10].m_family_name =
           L"HelveticaNeue";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x11].m_dirty_name_hash,
                 L"TimesNewRomanPS",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x11].m_family_name =
           L"TimesNewRomanPS";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x12].m_dirty_name_hash,
                 L"TimesNewRomanPSMT",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x12].m_family_name =
           L"TimesNewRomanPSMT";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x13].m_dirty_name_hash,
                 L"OrachTech2Lotf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x13].m_family_name =
           L"OrachTech2Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x14].m_dirty_name_hash,
                 L"OrachTech2Lotf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x14].m_family_name =
           L"OrachTech2Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x15].m_dirty_name_hash,
                 L"OrachTechDemo2Lotf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x15].m_family_name =
           L"OrachTechDemo2Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x16].m_dirty_name_hash,
                 L"OrachTechDemo2Lotf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x16].m_family_name =
           L"OrachTechDemo2Lotf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x17].m_dirty_name_hash,
                 L"OrachTech2Lttf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x17].m_family_name =
           L"OrachTech2Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x18].m_dirty_name_hash,
                 L"OrachTech2Lttf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x18].m_family_name =
           L"OrachTech2Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x19].m_dirty_name_hash,
                 L"OrachTechDemo2Lttf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x19].m_family_name =
           L"OrachTechDemo2Lttf";
      ON_Font::FontNameHash
                (&Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x1a].m_dirty_name_hash,
                 L"OrachTechDemo2Lttf",false);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map[0x1a].m_family_name =
           L"OrachTechDemo2Lttf";
      __cxa_guard_release(&Internal_FigureTypeFromHashedFontName(InternalHashToName_const*)::
                           perimeter_name_map);
    }
  }
  if (key == (InternalHashToName *)0x0) {
    TVar1 = Unknown;
  }
  else {
    if (Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count == 0) {
      Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::single_stroke_name_map,0x20);
      Internal_FigureTypeFromHashedFontName::double_stroke_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::double_stroke_name_map,0x16);
      Internal_FigureTypeFromHashedFontName::perimeter_name_map_count =
           InternalHashToName::SortAndCullByHash
                     (Internal_FigureTypeFromHashedFontName::perimeter_name_map,0x1b);
    }
    pvVar3 = bsearch(key,Internal_FigureTypeFromHashedFontName::single_stroke_name_map,
                     Internal_FigureTypeFromHashedFontName::single_stroke_name_map_count,0x20,
                     InternalHashToName::CompareHash);
    TVar1 = SingleStroke;
    if (pvVar3 == (void *)0x0) {
      pvVar3 = bsearch(key,Internal_FigureTypeFromHashedFontName::double_stroke_name_map,
                       Internal_FigureTypeFromHashedFontName::double_stroke_name_map_count,0x20,
                       InternalHashToName::CompareHash);
      TVar1 = DoubleStroke;
      if (pvVar3 == (void *)0x0) {
        pvVar3 = bsearch(key,Internal_FigureTypeFromHashedFontName::perimeter_name_map,
                         Internal_FigureTypeFromHashedFontName::perimeter_name_map_count,0x20,
                         InternalHashToName::CompareHash);
        TVar1 = (pvVar3 != (void *)0x0) << 2;
      }
    }
  }
  return TVar1;
}

Assistant:

static ON_OutlineFigure::Type Internal_FigureTypeFromHashedFontName(
  const InternalHashToName* key
)
{
  static InternalHashToName single_stroke_name_map[] = 
  {
    // Known single stroke fonts names
                                                   
    // Machine Tool
    InternalHashToName(L"Machine Tool Gothic"), // Family
    InternalHashToName(L"MachineToolGothic"), // PostScript
    InternalHashToName(L"Machine Tool Grenadier"), // Family
    InternalHashToName(L"MachineToolGrenadier"), // PostScript
    InternalHashToName(L"Machine Tool Handscript"), // Family
    InternalHashToName(L"MachineToolHandscript"), // PostScript
    InternalHashToName(L"Machine Tool SanSerif"), // Family
    InternalHashToName(L"MachineToolSanSerif"), // PostScript
    InternalHashToName(L"Machine Tool Script"), // Family
    InternalHashToName(L"MachineToolScript"), // PostScript

    // MecSoft
    InternalHashToName(L"MecSoft_Font-1"), // Family
    InternalHashToName(L"MecSoft_Font-1"), // PostScript

    // Orach Technic 1L
    InternalHashToName(L"OrachTech1Lotf"), // Family
    InternalHashToName(L"OrachTech1Lotf"), // PostScript
    InternalHashToName(L"OrachTechDemo1Lotf"), // Family
    InternalHashToName(L"OrachTechDemo1Lotf"), // PostScript
    InternalHashToName(L"OrachTech1Lttf"), // Family
    InternalHashToName(L"OrachTech1Lttf"), // PostScript
    InternalHashToName(L"OrachTechDemo1Lttf"), // Family
    InternalHashToName(L"OrachTechDemo1Lttf"), // PostScript

    // Rhino Single Stroke by Lowell Walmsley 
    InternalHashToName(L"RHSS"), // Family
    InternalHashToName(L"RhSS-Normal"), // PostScript

    // SD Stroke Open Type Font
    InternalHashToName(L"SDstroke"), // Family
    InternalHashToName(L"SDstroke-latin"), // PostScript


    // Single line fonts
    // Included here for now until 
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-57328
    // Gets fonts with the field 10 description set.
    InternalHashToName(L"SLF-RHN Architect"), // Family
    InternalHashToName(L"SLF-RHN-Architect"), // PostScript

    InternalHashToName(L"SLF-RHN Industrial"), // Family
    InternalHashToName(L"SLF-RHN-Industrial"), // PostScript

    InternalHashToName(L"SLF-RHN White Linen"), // Family
    InternalHashToName(L"SLF-RHN-WhiteLiinen"), // PostScript

    // https://mcneel.myjetbrains.com/youtrack/issue/RH-67652
    InternalHashToName(L"AVGauge Engraving"), // Family
    InternalHashToName(L"AVGauge_Engraving"), // PostScript
  };

  static InternalHashToName double_stroke_name_map[] = 
  {
    // Known double stroke fonts names
    //  If a double stroke font is treated as a single stroke font,
    //  then the "TrueType" automatic closure segment is dropped
    //  and glyphs for code points like o O 8 Q, ... have missing segments.
   
    // CamBam Stick fonts
    InternalHashToName(L"1CamBam_Stick_1"), // Family
    InternalHashToName(L"1CamBamStick1-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_2"), // Family
    InternalHashToName(L"1CamBamStick2-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_3"), // Family
    InternalHashToName(L"1CamBamStick3-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_4"), // Family
    InternalHashToName(L"1CamBamStick4-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_5"), // Family
    InternalHashToName(L"1CamBamStick5-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_6"), // Family
    InternalHashToName(L"1CamBamStick6-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_7"), // Family
    InternalHashToName(L"1CamBamStick7-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_8"), // Family
    InternalHashToName(L"1CamBamStick8-normal"), // PostScript
    InternalHashToName(L"1CamBam_Stick_9"), // Family
    InternalHashToName(L"1CamBamStick9"), // PostScript

    // CNC Vector
    InternalHashToName(L"CNC Vector"), // Family
    InternalHashToName(L"CNCVector"), // PostScript
    InternalHashToName(L"CNC Vector Mirror"), // Family
    InternalHashToName(L"CNCVectorMirror"), // PostScript

    // NOTE WELL: 
    //  Orach Technic 2L fonts are NOT a double stroke fonts.
    //  The figure outlines are simple closed perimenters
    //  that contain postive areas. 
    //  The behave poorly in simulated bold face.
  };

  static InternalHashToName perimeter_name_map[] = 
  {
    // Known perimeter stroke fonts names
    //  In fact, almost every TrueType, PostScript, and OpenType font
    //  has periemter figures. The list below contains fonts
    //  that some people might think are single or double stroke
    //  and common fonts so we don't keep checking.

    // Common
    InternalHashToName(L"Arial"),
    InternalHashToName(L"Bahnschrift"),
    InternalHashToName(L"CityBlueprint"),
    InternalHashToName(L"CountryBlueprint"),
    InternalHashToName(L"Courier"),
    InternalHashToName(L"Courier New"),
    InternalHashToName(L"Franklin Gothic"),
    InternalHashToName(L"Helvetica"),
    InternalHashToName(L"Helvetica Neue"),
    InternalHashToName(L"Segoe UI"),
    InternalHashToName(L"Times New Roman"),
    InternalHashToName(L"Tecnnic"),
    InternalHashToName(L"ArialMT"),
    InternalHashToName(L"CourierNewPS"),
    InternalHashToName(L"CourierNewPSMT"),
    InternalHashToName(L"FranklinGothic"),
    InternalHashToName(L"HelveticaNeue"),
    InternalHashToName(L"TimesNewRomanPS"),
    InternalHashToName(L"TimesNewRomanPSMT"),
   
    // Orach Technic 1L
    InternalHashToName(L"OrachTech2Lotf"), // Family
    InternalHashToName(L"OrachTech2Lotf"), // PostScript
    InternalHashToName(L"OrachTechDemo2Lotf"), // Family
    InternalHashToName(L"OrachTechDemo2Lotf"), // PostScript
    InternalHashToName(L"OrachTech2Lttf"), // Family
    InternalHashToName(L"OrachTech2Lttf"), // PostScript
    InternalHashToName(L"OrachTechDemo2Lttf"), // Family
    InternalHashToName(L"OrachTechDemo2Lttf"), // PostScript
  };

  static size_t single_stroke_name_map_count = 0;
  static size_t double_stroke_name_map_count = 0;
  static size_t perimeter_name_map_count = 0;

  if ( nullptr == key)
    return ON_OutlineFigure::Type::Unknown;

  const InternalHashToName* e;
  const size_t sizeof_e = sizeof(*e);

  if (0 == single_stroke_name_map_count)
  {
    single_stroke_name_map_count = InternalHashToName::SortAndCullByHash(single_stroke_name_map, (sizeof(single_stroke_name_map) / sizeof_e));
    double_stroke_name_map_count = InternalHashToName::SortAndCullByHash(double_stroke_name_map, (sizeof(double_stroke_name_map) / sizeof_e));
    perimeter_name_map_count = InternalHashToName::SortAndCullByHash(perimeter_name_map, (sizeof(perimeter_name_map) / sizeof_e));
  }


  e = (const InternalHashToName*)bsearch(key, single_stroke_name_map, single_stroke_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::SingleStroke;

  e = (const InternalHashToName*)bsearch(key, double_stroke_name_map, double_stroke_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::DoubleStroke;

  e = (const InternalHashToName*)bsearch(key, perimeter_name_map, perimeter_name_map_count, sizeof_e, InternalHashToName::CompareHash);
  if (nullptr != e)
    return ON_OutlineFigure::Type::Perimeter;

  // return Unset instead of Unknown in this internal tool
  return ON_OutlineFigure::Type::Unset;
}